

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O0

VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>
Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::getEmpty(void)

{
  int iVar1;
  IteratorCore<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *core;
  IteratorCore<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *in_RDI;
  
  if (VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs*>::getEmpty()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs*>::
                                 getEmpty()::inst);
    if (iVar1 != 0) {
      core = (IteratorCore<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)
             EmptyIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs*>::operator_new(0x3f4eaa);
      EmptyIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::EmptyIterator
                ((EmptyIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)core);
      VirtualIterator(&getEmpty::inst,core);
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs*>::getEmpty()
                           ::inst);
    }
  }
  VirtualIterator((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)in_RDI,
                  &getEmpty::inst);
  return (VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>)in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }